

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

optional<std::__cxx11::string> * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::
value_or_eval<__lest_function__1125(lest::env&)::__2>
          (optional<std::__cxx11::string> *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param_2)

{
  value_type *pvVar1;
  char *pcVar2;
  bool local_96;
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  optional<std::__cxx11::string> *local_10;
  
  local_20 = param_2;
  local_10 = this;
  local_96 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::has_value(param_2);
  if (local_96) {
    pvVar1 = detail::
             storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&param_2->contained);
    std::__cxx11::string::string(local_40,(string *)pvVar1);
  }
  else {
    pcVar2 = __lest_function__1125::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&this_local + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar2,&local_81);
    std::__cxx11::string::string(local_60,local_80);
    std::__cxx11::string::string(local_40,local_60);
  }
  local_96 = !local_96;
  std::__cxx11::string::string((string *)this,local_40);
  std::__cxx11::string::~string(local_40);
  if (local_96) {
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return this;
}

Assistant:

optional_constexpr value_type value_or_eval( F f ) const &
    {
        return has_value() ? contained.value() : f();
    }